

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Builder * __thiscall
capnp::LocalCallContext::getResults
          (Builder *__return_storage_ptr__,LocalCallContext *this,
          Maybe<capnp::MessageSize> *sizeHint)

{
  uint *puVar1;
  bool bVar2;
  ResponseHook *pRVar3;
  Disposer *pDVar4;
  CapTableBuilder *pCVar5;
  LocalResponse *this_00;
  ResponseHook *ptrCopy;
  NullableValue<capnp::MessageSize> local_68;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  NullableValue<capnp::MessageSize> local_40;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  if ((this->response).ptr.isSet == false) {
    this_00 = (LocalResponse *)operator_new(0x108);
    bVar2 = (sizeHint->ptr).isSet;
    local_68.isSet = bVar2;
    if (bVar2 == true) {
      local_68.field_1.value.wordCount = (sizeHint->ptr).field_1.value.wordCount;
      local_68.field_1._8_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
    }
    LocalResponse::LocalResponse(this_00,(Maybe<capnp::MessageSize> *)&local_68);
    puVar1 = &(this_00->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    MessageBuilder::getRootInternal((Builder *)&local_68,&(this_00->message).super_MessageBuilder);
    (this->responseBuilder).builder.pointer = (WirePointer *)local_68.field_1._8_8_;
    (this->responseBuilder).builder.segment =
         (SegmentBuilder *)CONCAT44(local_68._4_4_,local_68._0_4_);
    (this->responseBuilder).builder.capTable = (CapTableBuilder *)local_68.field_1.value.wordCount;
    capnp::_::PointerBuilder::asReader(&(this->responseBuilder).builder);
    local_68.field_1._12_4_ = local_40.field_1._12_4_;
    local_68.field_1.value.capCount = local_40.field_1._8_4_;
    uStack_50 = uStack_28;
    uStack_4c = uStack_24;
    local_68.isSet = local_40.isSet;
    local_68._1_3_ = local_40._1_3_;
    local_68._4_4_ = local_40._4_4_;
    local_68.field_1.value.wordCount._4_4_ = local_40.field_1._4_4_;
    local_68.field_1.value.wordCount._0_4_ = local_40.field_1._0_4_;
    if ((this->response).ptr.isSet == true) {
      (this->response).ptr.isSet = false;
      pRVar3 = (this->response).ptr.field_1.value.hook.ptr;
      if (pRVar3 != (ResponseHook *)0x0) {
        (this->response).ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
        pDVar4 = (this->response).ptr.field_1.value.hook.disposer;
        (**pDVar4->_vptr_Disposer)
                  (pDVar4,(_func_int *)
                          ((long)&pRVar3->_vptr_ResponseHook + (long)pRVar3->_vptr_ResponseHook[-2])
                  );
      }
    }
    (this->response).ptr.field_1.value.super_Reader.reader.pointer =
         (WirePointer *)local_68.field_1._8_8_;
    *(ulong *)&(this->response).ptr.field_1.value.super_Reader.reader.nestingLimit =
         CONCAT44(uStack_4c,uStack_50);
    (this->response).ptr.field_1.value.super_Reader.reader.segment =
         (SegmentReader *)CONCAT44(local_68._4_4_,local_68._0_4_);
    (this->response).ptr.field_1.value.super_Reader.reader.capTable =
         (CapTableReader *)local_68.field_1.value.wordCount;
    (this->response).ptr.field_1.value.hook.disposer = &(this_00->super_Refcounted).super_Disposer;
    (this->response).ptr.field_1.value.hook.ptr = (ResponseHook *)this_00;
    (this->response).ptr.isSet = true;
  }
  (__return_storage_ptr__->builder).pointer = (this->responseBuilder).builder.pointer;
  pCVar5 = (this->responseBuilder).builder.capTable;
  (__return_storage_ptr__->builder).segment = (this->responseBuilder).builder.segment;
  (__return_storage_ptr__->builder).capTable = pCVar5;
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResults(kj::Maybe<MessageSize> sizeHint) override {
    if (response == nullptr) {
      auto localResponse = kj::refcounted<LocalResponse>(sizeHint);
      responseBuilder = localResponse->message.getRoot<AnyPointer>();
      response = Response<AnyPointer>(responseBuilder.asReader(), kj::mv(localResponse));
    }
    return responseBuilder;
  }